

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O0

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::set_rom_is_overlay
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this,bool rom_is_overlay)

{
  anon_class_1_1_ce62ea48 local_39;
  function<void_(std::function<void_(int,_Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>)>
  local_38;
  undefined1 local_11;
  ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *pCStack_10;
  bool rom_is_overlay_local;
  ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this_local;
  
  this->ROM_is_overlay_ = rom_is_overlay;
  local_39.rom_is_overlay = rom_is_overlay;
  local_11 = rom_is_overlay;
  pCStack_10 = this;
  std::
  function<void(std::function<void(int,Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>)>
  ::
  function<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::set_rom_is_overlay(bool)::_lambda(std::function<void(int,Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>)_2_,void>
            ((function<void(std::function<void(int,Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>)>
              *)&local_38,&local_39);
  populate_memory_map(this,0,&local_38);
  std::
  function<void_(std::function<void_(int,_Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>)>
  ::~function(&local_38);
  return;
}

Assistant:

void set_rom_is_overlay(bool rom_is_overlay) {
			ROM_is_overlay_ = rom_is_overlay;

			using Model = Analyser::Static::Macintosh::Target::Model;
			switch(model) {
				case Model::Mac128k:
				case Model::Mac512k:
				case Model::Mac512ke:
					populate_memory_map(0, [rom_is_overlay] (std::function<void(int target, BusDevice device)> map_to) {
						// Addresses up to $80 0000 aren't affected by this bit.
						if(rom_is_overlay) {
							// Up to $60 0000 mirrors of the ROM alternate with unassigned areas every $10 0000 byes.
							for(int c = 0; c < 0x600000; c += 0x100000) {
								map_to(c + 0x100000, (c & 0x100000) ? BusDevice::Unassigned : BusDevice::ROM);
							}
							map_to(0x800000, BusDevice::RAM);
						} else {
							map_to(0x400000, BusDevice::RAM);
							map_to(0x500000, BusDevice::ROM);
							map_to(0x800000, BusDevice::Unassigned);
						}
					});
				break;

				case Model::MacPlus:
					populate_memory_map(0, [rom_is_overlay] (std::function<void(int target, BusDevice device)> map_to) {
						// Addresses up to $80 0000 aren't affected by this bit.
						if(rom_is_overlay) {
							for(int c = 0; c < 0x580000; c += 0x20000) {
								map_to(c + 0x20000, ((c & 0x100000) || (c & 0x20000)) ? BusDevice::Unassigned : BusDevice::ROM);
							}
							map_to(0x600000, BusDevice::SCSI);
							map_to(0x800000, BusDevice::RAM);
						} else {
							map_to(0x400000, BusDevice::RAM);
							for(int c = 0x400000; c < 0x580000; c += 0x20000) {
								map_to(c + 0x20000, ((c & 0x100000) || (c & 0x20000)) ? BusDevice::Unassigned : BusDevice::ROM);
							}
							map_to(0x600000, BusDevice::SCSI);
							map_to(0x800000, BusDevice::Unassigned);
						}
					});
				break;
			}
		}